

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O0

void __thiscall
wasm::ModuleUtils::CallGraphPropertyAnalysis<Info>::CallGraphPropertyAnalysis
          (CallGraphPropertyAnalysis<Info> *this,Module *wasm,Func *work)

{
  bool bVar1;
  reference __in;
  type *__x;
  type *this_00;
  reference ppFVar2;
  mapped_type *pmVar3;
  Function *local_e8;
  Function *target;
  iterator __end0_1;
  iterator __begin0_1;
  set<wasm::Function_*,_std::less<wasm::Function_*>,_std::allocator<wasm::Function_*>_> *__range4;
  type *info;
  type *func;
  _Self local_b0;
  iterator __end0;
  iterator __begin0;
  Map *__range3;
  anon_class_16_2_4015124c local_88;
  Func local_78;
  undefined1 local_58 [8];
  ParallelFunctionAnalysis<Info,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap> analysis;
  Func *work_local;
  Module *wasm_local;
  CallGraphPropertyAnalysis<Info> *this_local;
  
  this->wasm = wasm;
  analysis._48_8_ = work;
  std::
  map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
  ::map(&this->map);
  local_88.work = work;
  local_88.wasm = wasm;
  std::
  function<void(wasm::Function*,wasm::PostEmscripten::optimizeExceptions(wasm::Module*)::Info&)>::
  function<wasm::ModuleUtils::CallGraphPropertyAnalysis<wasm::PostEmscripten::optimizeExceptions(wasm::Module*)::Info>::CallGraphPropertyAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::PostEmscripten::optimizeExceptions(wasm::Module*)::Info&)>)::_lambda(wasm::Function*,wasm::PostEmscripten::optimizeExceptions(wasm::Module*)::Info&)_1_,void>
            ((function<void(wasm::Function*,wasm::PostEmscripten::optimizeExceptions(wasm::Module*)::Info&)>
              *)&local_78,&local_88);
  ParallelFunctionAnalysis<Info,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>::
  ParallelFunctionAnalysis
            ((ParallelFunctionAnalysis<Info,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap> *)
             local_58,wasm,&local_78);
  std::function<void_(wasm::Function_*,_Info_&)>::~function
            ((function<void_(wasm::Function_*,_Info_&)> *)&local_78);
  std::
  map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
  ::swap(&this->map,
         (map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
          *)&analysis);
  __end0 = std::
           map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
           ::begin(&this->map);
  local_b0._M_node =
       (_Base_ptr)
       std::
       map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
       ::end(&this->map);
  while( true ) {
    bVar1 = std::operator!=(&__end0,&local_b0);
    if (!bVar1) break;
    __in = std::_Rb_tree_iterator<std::pair<wasm::Function_*const,_Info>_>::operator*(&__end0);
    __x = std::
          get<0ul,wasm::Function*const,wasm::PostEmscripten::optimizeExceptions(wasm::Module*)::Info>
                    (__in);
    this_00 = std::
              get<1ul,wasm::Function*const,wasm::PostEmscripten::optimizeExceptions(wasm::Module*)::Info>
                        (__in);
    __end0_1 = std::
               set<wasm::Function_*,_std::less<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
               ::begin((set<wasm::Function_*,_std::less<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                        *)this_00);
    target = (Function *)
             std::
             set<wasm::Function_*,_std::less<wasm::Function_*>,_std::allocator<wasm::Function_*>_>::
             end((set<wasm::Function_*,_std::less<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                  *)this_00);
    while( true ) {
      bVar1 = std::operator!=(&__end0_1,(_Self *)&target);
      if (!bVar1) break;
      ppFVar2 = std::_Rb_tree_const_iterator<wasm::Function_*>::operator*(&__end0_1);
      local_e8 = *ppFVar2;
      pmVar3 = std::
               map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
               ::operator[](&this->map,&local_e8);
      std::set<wasm::Function_*,_std::less<wasm::Function_*>,_std::allocator<wasm::Function_*>_>::
      insert(&(pmVar3->super_FunctionInfo).calledBy,__x);
      std::_Rb_tree_const_iterator<wasm::Function_*>::operator++(&__end0_1);
    }
    std::_Rb_tree_iterator<std::pair<wasm::Function_*const,_Info>_>::operator++(&__end0);
  }
  ParallelFunctionAnalysis<Info,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>::
  ~ParallelFunctionAnalysis
            ((ParallelFunctionAnalysis<Info,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap> *)
             local_58);
  return;
}

Assistant:

CallGraphPropertyAnalysis(Module& wasm, Func work) : wasm(wasm) {
    ParallelFunctionAnalysis<T> analysis(wasm, [&](Function* func, T& info) {
      work(func, info);
      if (func->imported()) {
        return;
      }
      struct Mapper : public PostWalker<Mapper> {
        Mapper(Module* module, T& info, Func work)
          : module(module), info(info), work(work) {}

        void visitCall(Call* curr) {
          info.callsTo.insert(module->getFunction(curr->target));
        }
        void visitCallIndirect(CallIndirect* curr) {
          info.hasNonDirectCall = true;
        }
        void visitCallRef(CallRef* curr) { info.hasNonDirectCall = true; }

      private:
        Module* module;
        T& info;
        Func work;
      } mapper(&wasm, info, work);
      mapper.walk(func->body);
    });

    map.swap(analysis.map);

    // Find what is called by what.
    for (auto& [func, info] : map) {
      for (auto* target : info.callsTo) {
        map[target].calledBy.insert(func);
      }
    }
  }